

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

_Bool rsa_ssh1_encrypt(uchar *data,int length,RSAKey *key)

{
  uint8_t uVar1;
  ulong uVar2;
  size_t bits;
  mp_int *pmVar3;
  mp_int *pmVar4;
  ptrlen bytes;
  uint8_t byte;
  mp_int *tmp;
  mp_int *randval;
  size_t random_bits;
  size_t npad;
  uchar *p;
  int i;
  mp_int *b2;
  mp_int *b1;
  RSAKey *key_local;
  int length_local;
  uchar *data_local;
  
  if (key->bytes < length + 4) {
    data_local._7_1_ = false;
  }
  else {
    memmove(data + ((long)key->bytes - (long)length),data,(long)length);
    *data = '\0';
    data[1] = '\x02';
    uVar2 = (long)((key->bytes - length) + -3) + 0x10;
    bits = uVar2 * 8;
    pmVar3 = mp_new(bits + 8);
    pmVar4 = mp_random_bits_fn(bits,random_read);
    mp_copy_into(pmVar3,pmVar4);
    mp_free(pmVar4);
    for (p._4_4_ = 2; p._4_4_ < (key->bytes - length) + -1; p._4_4_ = p._4_4_ + 1) {
      mp_mul_integer_into(pmVar3,pmVar3,0xff);
      uVar1 = mp_get_byte(pmVar3,uVar2 & 0x1fffffffffffffff);
      if (uVar1 == 0xff) {
        __assert_fail("byte != 255",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/rsa.c"
                      ,0x76,"_Bool rsa_ssh1_encrypt(unsigned char *, int, RSAKey *)");
      }
      data[p._4_4_] = uVar1 + '\x01';
      mp_reduce_mod_2to(pmVar3,bits);
    }
    mp_free(pmVar3);
    data[(key->bytes - length) + -1] = '\0';
    bytes = make_ptrlen(data,(long)key->bytes);
    pmVar3 = mp_from_bytes_be(bytes);
    pmVar4 = mp_modpow(pmVar3,key->exponent,key->modulus);
    npad = (size_t)data;
    p._4_4_ = key->bytes;
    while (p._4_4_ != 0) {
      uVar1 = mp_get_byte(pmVar4,(long)(p._4_4_ + -1));
      *(uint8_t *)npad = uVar1;
      npad = npad + 1;
      p._4_4_ = p._4_4_ + -1;
    }
    mp_free(pmVar3);
    mp_free(pmVar4);
    data_local._7_1_ = true;
  }
  return data_local._7_1_;
}

Assistant:

bool rsa_ssh1_encrypt(unsigned char *data, int length, RSAKey *key)
{
    mp_int *b1, *b2;
    int i;
    unsigned char *p;

    if (key->bytes < length + 4)
        return false;                  /* RSA key too short! */

    memmove(data + key->bytes - length, data, length);
    data[0] = 0;
    data[1] = 2;

    size_t npad = key->bytes - length - 3;
    /*
     * Generate a sequence of nonzero padding bytes. We do this in a
     * reasonably uniform way and without having to loop round
     * retrying the random number generation, by first generating an
     * integer in [0,2^n) for an appropriately large n; then we
     * repeatedly multiply by 255 to give an integer in [0,255*2^n),
     * extract the top 8 bits to give an integer in [0,255), and mask
     * those bits off before multiplying up again for the next digit.
     * This gives us a sequence of numbers in [0,255), and of course
     * adding 1 to each of them gives numbers in [1,256) as we wanted.
     *
     * (You could imagine this being a sort of fixed-point operation:
     * given a uniformly random binary _fraction_, multiplying it by k
     * and subtracting off the integer part will yield you a sequence
     * of integers each in [0,k). I'm just doing that scaled up by a
     * power of 2 to avoid the fractions.)
     */
    size_t random_bits = (npad + 16) * 8;
    mp_int *randval = mp_new(random_bits + 8);
    mp_int *tmp = mp_random_bits(random_bits);
    mp_copy_into(randval, tmp);
    mp_free(tmp);
    for (i = 2; i < key->bytes - length - 1; i++) {
        mp_mul_integer_into(randval, randval, 255);
        uint8_t byte = mp_get_byte(randval, random_bits / 8);
        assert(byte != 255);
        data[i] = byte + 1;
        mp_reduce_mod_2to(randval, random_bits);
    }
    mp_free(randval);
    data[key->bytes - length - 1] = 0;

    b1 = mp_from_bytes_be(make_ptrlen(data, key->bytes));

    b2 = mp_modpow(b1, key->exponent, key->modulus);

    p = data;
    for (i = key->bytes; i--;) {
        *p++ = mp_get_byte(b2, i);
    }

    mp_free(b1);
    mp_free(b2);

    return true;
}